

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareCosDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  uint uVar1;
  longdouble *in_RCX;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble local_18;
  
  GetCosDistance((longdouble *)x,y,(Vector3_ld *)&stack0xffffffffffffffe8,in_RCX);
  lVar2 = (longdouble)1 + r2 * (longdouble)-0.5;
  in_ST0 = in_ST0 - lVar2;
  local_18 = local_18 + lVar2 * (longdouble)1.0842022e-19;
  uVar1 = 0xffffffff;
  if (in_ST0 <= local_18) {
    uVar1 = (uint)(in_ST0 < -local_18);
  }
  return uVar1;
}

Assistant:

int TriageCompareCosDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();
  T cos_xy_error;
  T cos_xy = GetCosDistance(x, y, &cos_xy_error);
  T cos_r = 1 - 0.5 * r2;
  T cos_r_error = 2 * T_ERR * cos_r;
  T diff = cos_xy - cos_r;
  T error = cos_xy_error + cos_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}